

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_pack(REF_CELL ref_cell,REF_INT *o2n)

{
  REF_INT *pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  int iVar4;
  REF_INT *pRVar5;
  REF_INT *sorted_index;
  void *__ptr;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  REF_INT cell;
  int reference;
  ulong uVar14;
  REF_INT nodes [27];
  int local_a8 [30];
  
  iVar12 = ref_cell->max;
  if (iVar12 < 1) {
    uVar8 = 0;
  }
  else {
    cell = 0;
    uVar8 = 0;
    do {
      RVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar2 == 0) {
        iVar12 = ref_cell->node_per;
        if (0 < iVar12) {
          pRVar5 = ref_cell->c2n;
          lVar10 = 0;
          do {
            pRVar5[(long)ref_cell->size_per * (long)(int)uVar8 + lVar10] = o2n[local_a8[lVar10]];
            lVar10 = lVar10 + 1;
            iVar12 = ref_cell->node_per;
          } while (lVar10 < iVar12);
        }
        if (ref_cell->last_node_is_an_id != 0) {
          ref_cell->c2n[(int)(iVar12 + ref_cell->size_per * uVar8)] = local_a8[iVar12];
        }
        uVar8 = uVar8 + 1;
        iVar12 = ref_cell->max;
      }
      cell = cell + 1;
    } while (cell < iVar12);
  }
  if (uVar8 == ref_cell->n) {
    uVar3 = 0xffffffff;
    if ((int)uVar8 < iVar12) {
      pRVar5 = ref_cell->c2n;
      do {
        lVar10 = (long)(int)uVar8;
        pRVar5[ref_cell->size_per * lVar10] = -1;
        uVar8 = uVar8 + 1;
        pRVar5[ref_cell->size_per * lVar10 + 1] = uVar8;
      } while ((int)uVar8 < ref_cell->max);
      pRVar5[((long)ref_cell->max + -1) * (long)ref_cell->size_per + 1] = -1;
      uVar8 = ref_cell->n;
      uVar3 = uVar8;
    }
    ref_cell->blank = uVar3;
    if ((int)uVar8 < 0) {
      pcVar11 = "malloc key of REF_INT negative";
      uVar7 = 0x218;
    }
    else {
      pRVar5 = (REF_INT *)malloc((ulong)uVar8 << 2);
      if (pRVar5 == (REF_INT *)0x0) {
        pcVar11 = "malloc key of REF_INT NULL";
        uVar7 = 0x218;
LAB_0011ae22:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar7,"ref_cell_pack",pcVar11);
        return 2;
      }
      sorted_index = (REF_INT *)malloc((ulong)uVar8 << 2);
      if (sorted_index == (REF_INT *)0x0) {
        pcVar11 = "malloc order of REF_INT NULL";
        uVar7 = 0x219;
        goto LAB_0011ae22;
      }
      uVar3 = ref_cell->size_per * uVar8;
      if (-1 < (int)uVar3) {
        __ptr = malloc((ulong)uVar3 << 2);
        if (__ptr != (void *)0x0) {
          iVar12 = ref_cell->max;
          if (0 < (long)iVar12) {
            lVar10 = 0;
            do {
              RVar2 = ref_cell_nodes(ref_cell,(REF_INT)lVar10,local_a8);
              if (RVar2 == 0) {
                pRVar5[lVar10] = local_a8[0];
                if (1 < (long)ref_cell->node_per) {
                  lVar6 = 1;
                  iVar4 = local_a8[0];
                  do {
                    if (local_a8[lVar6] < iVar4) {
                      iVar4 = local_a8[lVar6];
                    }
                    lVar6 = lVar6 + 1;
                  } while (ref_cell->node_per != lVar6);
                  pRVar5[lVar10] = iVar4;
                }
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != iVar12);
          }
          uVar8 = ref_sort_heap_int(uVar8,pRVar5,sorted_index);
          if (uVar8 == 0) {
            uVar8 = ref_cell->n;
            uVar13 = (ulong)uVar8;
            if (0 < (int)uVar8) {
              uVar3 = ref_cell->size_per;
              uVar9 = 0;
              uVar14 = 0;
              do {
                if (0 < (int)uVar3) {
                  memcpy((void *)((long)__ptr + (ulong)uVar9 * 4),
                         ref_cell->c2n + (long)sorted_index[uVar14] * (long)(int)uVar3,
                         (ulong)uVar3 << 2);
                }
                uVar14 = uVar14 + 1;
                uVar9 = uVar9 + uVar3;
              } while (uVar13 != uVar14);
              if (0 < (int)uVar8) {
                iVar12 = ref_cell->size_per;
                iVar4 = 0;
                do {
                  if (0 < iVar12) {
                    pRVar1 = ref_cell->c2n;
                    lVar10 = 0;
                    do {
                      lVar6 = iVar12 * iVar4 + lVar10;
                      pRVar1[lVar6] = *(REF_INT *)((long)__ptr + lVar6 * 4);
                      iVar12 = ref_cell->size_per;
                      lVar10 = lVar10 + 1;
                    } while ((int)lVar10 < iVar12);
                    uVar13 = (ulong)(uint)ref_cell->n;
                  }
                  iVar4 = iVar4 + 1;
                } while (iVar4 < (int)uVar13);
              }
            }
            free(__ptr);
            free(sorted_index);
            free(pRVar5);
            uVar8 = ref_adj_free(ref_cell->ref_adj);
            if (uVar8 == 0) {
              uVar8 = ref_adj_create(&ref_cell->ref_adj);
              if (uVar8 == 0) {
                iVar12 = ref_cell->n;
                if (iVar12 < 1) {
                  return 0;
                }
                iVar4 = ref_cell->node_per;
                reference = 0;
                do {
                  if (0 < iVar4) {
                    lVar10 = 0;
                    do {
                      uVar8 = ref_adj_add(ref_cell->ref_adj,
                                          ref_cell->c2n
                                          [(long)ref_cell->size_per * (long)reference + lVar10],
                                          reference);
                      if (uVar8 != 0) {
                        pcVar11 = "register cell";
                        uVar7 = 0x23b;
                        goto LAB_0011afe2;
                      }
                      iVar4 = ref_cell->node_per;
                      lVar10 = lVar10 + 1;
                    } while ((int)lVar10 < iVar4);
                    iVar12 = ref_cell->n;
                  }
                  reference = reference + 1;
                  if (iVar12 <= reference) {
                    return 0;
                  }
                } while( true );
              }
              pcVar11 = "fresh ref_adj for ref_cell";
              uVar7 = 0x235;
            }
            else {
              pcVar11 = "free adj";
              uVar7 = 0x234;
            }
          }
          else {
            pcVar11 = "sort smallest";
            uVar7 = 0x222;
          }
LAB_0011afe2:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 uVar7,"ref_cell_pack",(ulong)uVar8,pcVar11);
          return uVar8;
        }
        pcVar11 = "malloc c2n of REF_INT NULL";
        uVar7 = 0x21b;
        goto LAB_0011ae22;
      }
      pcVar11 = "malloc c2n of REF_INT negative";
      uVar7 = 0x21b;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar7,
           "ref_cell_pack",pcVar11);
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x209,
           "ref_cell_pack","count is off",(long)(int)uVar8,(long)ref_cell->n);
  }
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_pack(REF_CELL ref_cell, REF_INT *o2n) {
  REF_INT node, cell, compact;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  compact = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      ref_cell_c2n(ref_cell, node, compact) = o2n[nodes[node]];
    if (ref_cell_last_node_is_an_id(ref_cell))
      ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), compact) =
          nodes[ref_cell_node_per(ref_cell)];
    compact++;
  }
  REIS(compact, ref_cell_n(ref_cell), "count is off");

  if (ref_cell_n(ref_cell) < ref_cell_max(ref_cell)) {
    for (cell = ref_cell_n(ref_cell); cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = ref_cell_n(ref_cell);
  } else {
    ref_cell_blank(ref_cell) = REF_EMPTY;
  }

  {
    REF_INT *key, *order, *c2n;
    ref_malloc(key, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(order, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(c2n, ref_cell_size_per(ref_cell) * ref_cell_n(ref_cell),
               REF_INT);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      key[cell] = nodes[0];
      for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
        if (nodes[node] < key[cell]) key[cell] = nodes[node];
      }
    }
    RSS(ref_sort_heap_int(ref_cell_n(ref_cell), key, order), "sort smallest");
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        c2n[node + cell * ref_cell_size_per(ref_cell)] =
            ref_cell_c2n(ref_cell, node, order[cell]);
      }
    }
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        ref_cell_c2n(ref_cell, node, cell) =
            c2n[node + cell * ref_cell_size_per(ref_cell)];
      }
    }
    ref_free(c2n);
    ref_free(order);
    ref_free(key);
  }

  RSS(ref_adj_free(ref_cell_adj(ref_cell)), "free adj");
  RSS(ref_adj_create(&(ref_cell->ref_adj)), "fresh ref_adj for ref_cell");

  for (cell = 0; cell < ref_cell_n(ref_cell); cell++)
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      RSS(ref_adj_add(ref_cell_adj(ref_cell),
                      ref_cell_c2n(ref_cell, node, cell), cell),
          "register cell");

  return REF_SUCCESS;
}